

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O1

ROMInfo ** MT32Emu::ROMInfo::getFullROMInfos(Bit32u *itemCount)

{
  long lVar1;
  undefined **ppuVar2;
  undefined8 *puVar3;
  
  if (itemCount != (Bit32u *)0x0) {
    if (getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ == 0) {
      getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_04_B;
      getROMInfoLists()::CTRL_MT32_V1_05_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_05_B;
      getROMInfoLists()::CTRL_MT32_V1_06_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_06_B;
      getROMInfoLists()::CTRL_MT32_V1_07_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_07_B;
      getROMInfoLists()::CTRL_MT32_BLUER_A._48_8_ = getROMInfoLists()::CTRL_MT32_BLUER_B;
      getROMInfoLists()::PCM_MT32_L._48_8_ = getROMInfoLists()::PCM_MT32_H;
      getROMInfoLists()::PCM_CM32L_L._48_8_ = getROMInfoLists()::PCM_CM32L_H;
      ppuVar2 = &getROMInfoLists()::FULL_ROM_INFOS;
      puVar3 = &getROMInfoLists()::ALL_ROM_INFOS;
      for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar3 = *ppuVar2;
        ppuVar2 = ppuVar2 + 1;
        puVar3 = puVar3 + 1;
      }
      ppuVar2 = &getROMInfoLists()::PARTIAL_ROM_INFOS;
      puVar3 = &DAT_001d14f0;
      for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar3 = *ppuVar2;
        ppuVar2 = ppuVar2 + 1;
        puVar3 = puVar3 + 1;
      }
    }
    *itemCount = 0xe;
  }
  if (getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ == 0) {
    getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_04_B;
    getROMInfoLists()::CTRL_MT32_V1_05_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_05_B;
    getROMInfoLists()::CTRL_MT32_V1_06_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_06_B;
    getROMInfoLists()::CTRL_MT32_V1_07_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_07_B;
    getROMInfoLists()::CTRL_MT32_BLUER_A._48_8_ = getROMInfoLists()::CTRL_MT32_BLUER_B;
    getROMInfoLists()::PCM_MT32_L._48_8_ = getROMInfoLists()::PCM_MT32_H;
    getROMInfoLists()::PCM_CM32L_L._48_8_ = getROMInfoLists()::PCM_CM32L_H;
    ppuVar2 = &getROMInfoLists()::FULL_ROM_INFOS;
    puVar3 = &getROMInfoLists()::ALL_ROM_INFOS;
    for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *ppuVar2;
      ppuVar2 = ppuVar2 + 1;
      puVar3 = puVar3 + 1;
    }
    ppuVar2 = &getROMInfoLists()::PARTIAL_ROM_INFOS;
    puVar3 = &DAT_001d14f0;
    for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *ppuVar2;
      ppuVar2 = ppuVar2 + 1;
      puVar3 = puVar3 + 1;
    }
  }
  return (ROMInfo **)&getROMInfoLists()::FULL_ROM_INFOS;
}

Assistant:

const ROMInfo * const *ROMInfo::getFullROMInfos(Bit32u *itemCount) {
	if (itemCount != NULL) *itemCount = getROMInfoLists().fullROMInfos.itemCount;
	return getROMInfoLists().fullROMInfos.romInfos;
}